

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# ascii.h
# Opt level: O0

string_view absl::StripTrailingAsciiWhitespace(string_view str)

{
  basic_string_view<char,_std::char_traits<char>_> bVar1;
  string_view sVar2;
  reverse_iterator<const_char_*> it;
  reverse_iterator<const_char_*> *__y;
  reverse_iterator<const_char_*> *__x;
  basic_string_view<char,_std::char_traits<char>_> *in_stack_ffffffffffffffa8;
  undefined1 *__n;
  undefined1 *__pos;
  basic_string_view<char,_std::char_traits<char>_> *in_stack_ffffffffffffffc0;
  reverse_iterator<const_char_*> in_stack_ffffffffffffffc8;
  reverse_iterator<const_char_*> in_stack_ffffffffffffffd0;
  reverse_iterator<const_char_*> *in_stack_ffffffffffffffd8;
  undefined1 local_20 [32];
  
  __y = (reverse_iterator<const_char_*> *)&stack0xffffffffffffffd0;
  __pos = local_20;
  std::basic_string_view<char,_std::char_traits<char>_>::rbegin(in_stack_ffffffffffffffa8);
  __x = (reverse_iterator<const_char_*> *)&stack0xffffffffffffffc8;
  std::basic_string_view<char,_std::char_traits<char>_>::rend(in_stack_ffffffffffffffa8);
  __n = &stack0xffffffffffffffd8;
  std::find_if_not<std::reverse_iterator<char_const*>,bool(*)(unsigned_char)>
            (in_stack_ffffffffffffffd8,
             (reverse_iterator<const_char_*> *)in_stack_ffffffffffffffd0.current,
             (_func_bool_uchar *)in_stack_ffffffffffffffc8.current);
  std::basic_string_view<char,_std::char_traits<char>_>::rend
            ((basic_string_view<char,_std::char_traits<char>_> *)&stack0xffffffffffffffc0);
  std::operator-(__x,__y);
  bVar1 = std::basic_string_view<char,_std::char_traits<char>_>::substr
                    (in_stack_ffffffffffffffc0,(size_type)__pos,(size_type)__n);
  sVar2._M_len = bVar1._M_len;
  sVar2._M_str = bVar1._M_str;
  return sVar2;
}

Assistant:

ABSL_MUST_USE_RESULT inline absl::string_view StripTrailingAsciiWhitespace(
    absl::string_view str) {
  auto it = std::find_if_not(str.rbegin(), str.rend(), absl::ascii_isspace);
  return str.substr(0, static_cast<size_t>(str.rend() - it));
}